

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O0

vec3 __thiscall fw::FreeCamera::getWorldRightDirection(FreeCamera *this)

{
  vec3 vVar1;
  tvec3<float,_(glm::precision)0> tVar2;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 aVar3;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_60;
  undefined1 local_50 [16];
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_40;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_30;
  FreeCamera *local_20;
  FreeCamera *this_local;
  
  local_20 = this;
  local_50._0_12_ = (undefined1  [12])getWorldForwardDirection(this);
  local_40.field_0.z = (float)local_50._8_4_;
  local_40._0_8_ = local_50._0_8_;
  vVar1 = getWorldUpDirection(this);
  local_68 = vVar1.field_0._8_4_;
  local_60.field_0.z = local_68;
  local_70 = vVar1.field_0._0_8_;
  local_60._0_8_ = local_70;
  tVar2 = glm::cross<float,(glm::precision)0>
                    ((tvec3<float,_(glm::precision)0> *)&local_40.field_0,
                     (tvec3<float,_(glm::precision)0> *)&local_60.field_0);
  local_78 = tVar2.field_0._8_4_;
  local_30.field_0.z = local_78;
  local_80 = tVar2.field_0._0_8_;
  local_30._0_8_ = local_80;
  aVar3.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::normalize<float,(glm::precision)0,glm::tvec3>
                   ((tvec3<float,_(glm::precision)0> *)&local_30.field_0);
  return (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)
         (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)aVar3.field_0;
}

Assistant:

glm::vec3 FreeCamera::getWorldRightDirection() const
{
    return glm::normalize(
        glm::cross(getWorldForwardDirection(), getWorldUpDirection())
    );
}